

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wizard.c
# Opt level: O0

long strategy(monst *mtmp)

{
  int iVar1;
  long lVar2;
  monst *local_28;
  long dstrat;
  long strat;
  monst *mtmp_local;
  
  if (((mtmp->data->mflags3 & 0x1f) == 0) ||
     (((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) != 0 && (iVar1 = inhishop(mtmp), iVar1 != 0)))) {
    return 0;
  }
  switch((long)(mtmp->mhp * 3) / (long)mtmp->mhpmax & 0xffffffff) {
  default:
    return 0x8000000;
  case 1:
    if (mtmp->data != mons + 0x128) {
      return 0x8000000;
    }
  case 2:
    local_28 = (monst *)0x8000000;
    break;
  case 3:
    local_28 = (monst *)0x0;
  }
  if ((flags.made_amulet == '\0') ||
     (mtmp_local = (monst *)target_on(1,mtmp), mtmp_local == (monst *)0x0)) {
    if (((ushort)u.uevent._0_2_ >> 9 & 1) == 0) {
      lVar2 = target_on(4,mtmp);
      if (lVar2 != 0) {
        return lVar2;
      }
      lVar2 = target_on(2,mtmp);
      if (lVar2 != 0) {
        return lVar2;
      }
      lVar2 = target_on(8,mtmp);
      if (lVar2 != 0) {
        return lVar2;
      }
      mtmp_local = (monst *)target_on(0x10,mtmp);
    }
    else {
      lVar2 = target_on(0x10,mtmp);
      if (lVar2 != 0) {
        return lVar2;
      }
      lVar2 = target_on(4,mtmp);
      if (lVar2 != 0) {
        return lVar2;
      }
      lVar2 = target_on(2,mtmp);
      if (lVar2 != 0) {
        return lVar2;
      }
      mtmp_local = (monst *)target_on(8,mtmp);
    }
    if (mtmp_local == (monst *)0x0) {
      mtmp_local = local_28;
    }
  }
  return (long)mtmp_local;
}

Assistant:

static long strategy(struct monst *mtmp)
{
	long strat, dstrat;

	if (!is_covetous(mtmp->data) ||
		/* perhaps a shopkeeper has been polymorphed into a master
		   lich; we don't want it teleporting to the stairs to heal
		   because that will leave its shop untended */
		(mtmp->isshk && inhishop(mtmp)))
	    return STRAT_NONE;

	switch((mtmp->mhp*3)/mtmp->mhpmax) {	/* 0-3 */

	   default:
	    case 0:	/* panic time - mtmp is almost snuffed */
			return STRAT_HEAL;

	    case 1:	/* the wiz is less cautious */
			if (mtmp->data != &mons[PM_WIZARD_OF_YENDOR])
			    return STRAT_HEAL;
			/* else fall through */

	    case 2:	dstrat = STRAT_HEAL;
			break;

	    case 3:	dstrat = STRAT_NONE;
			break;
	}

	if (flags.made_amulet)
	    if ((strat = target_on(M3_WANTSAMUL, mtmp)) != STRAT_NONE)
		return strat;

	if (u.uevent.invoked) {		/* priorities change once gate opened */

	    if ((strat = target_on(M3_WANTSARTI, mtmp)) != STRAT_NONE)
		return strat;
	    if ((strat = target_on(M3_WANTSBOOK, mtmp)) != STRAT_NONE)
		return strat;
	    if ((strat = target_on(M3_WANTSBELL, mtmp)) != STRAT_NONE)
		return strat;
	    if ((strat = target_on(M3_WANTSCAND, mtmp)) != STRAT_NONE)
		return strat;
	} else {

	    if ((strat = target_on(M3_WANTSBOOK, mtmp)) != STRAT_NONE)
		return strat;
	    if ((strat = target_on(M3_WANTSBELL, mtmp)) != STRAT_NONE)
		return strat;
	    if ((strat = target_on(M3_WANTSCAND, mtmp)) != STRAT_NONE)
		return strat;
	    if ((strat = target_on(M3_WANTSARTI, mtmp)) != STRAT_NONE)
		return strat;
	}
	return dstrat;
}